

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall fs::Path::setFile(Path *this,string *file)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  long local_30;
  size_type ext;
  size_type local_20;
  string *local_18;
  string *file_local;
  Path *this_local;
  
  local_18 = file;
  file_local = &this->_complete;
  std::initializer_list<char>::initializer_list((initializer_list<char> *)&ext);
  std::__cxx11::string::operator=((string *)&this->_extension,ext,local_20);
  local_30 = std::__cxx11::string::find_last_of((char)local_18,0x2e);
  if (local_30 == 0) {
    std::__cxx11::string::operator=((string *)&this->_stem,(string *)local_18);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    psVar1 = local_18;
    if (local_30 == -1) {
      std::__cxx11::string::size();
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_50,pcVar2,pcVar3,&local_51);
    std::__cxx11::string::operator=((string *)&this->_stem,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    if (local_30 != -1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      psVar1 = local_18;
      std::__cxx11::string::size();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_88,pcVar2,pcVar3,&local_89);
      std::__cxx11::string::operator=((string *)&this->_extension,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  updateFile(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setFile(std::string const& file)
{
  _extension = {};
  auto ext = file.find_last_of('.');
  if (ext != 0)
  {
    _stem = std::string (&file[0], &file[ext == file.npos ? file.size() : ext]);
    if (ext != file.npos)
    {
      _extension = std::string (&file[ext], &file[file.size()]);
    }
  }
  else
  {
    _stem = file;
  }
  updateFile();
  return *this;
}